

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O0

void __thiscall
shaping_clipper::clip_to_window
          (shaping_clipper *this,float *windowed_frame,float *clipping_delta,float delta_boost)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float effective_value;
  float limit;
  int i;
  int window_stride;
  int total_samples;
  float *window;
  float delta_boost_local;
  float *clipping_delta_local;
  float *windowed_frame_local;
  shaping_clipper *this_local;
  
  _window_stride = std::vector<float,_std::allocator<float>_>::data(&this->window);
  iVar1 = this->size;
  iVar2 = this->oversample;
  iVar3 = this->max_oversample;
  iVar4 = this->oversample;
  for (effective_value = 0.0; (int)effective_value < iVar1 * iVar2;
      effective_value = (float)((int)effective_value + 1)) {
    fVar5 = this->clip_level * *_window_stride;
    fVar6 = windowed_frame[(int)effective_value] + clipping_delta[(int)effective_value];
    if (fVar6 <= fVar5) {
      if (fVar6 < -fVar5) {
        clipping_delta[(int)effective_value] =
             (-fVar5 - fVar6) * delta_boost + clipping_delta[(int)effective_value];
      }
    }
    else {
      clipping_delta[(int)effective_value] =
           (fVar5 - fVar6) * delta_boost + clipping_delta[(int)effective_value];
    }
    _window_stride = _window_stride + iVar3 / iVar4;
  }
  return;
}

Assistant:

void shaping_clipper::clip_to_window(const float* windowed_frame, float* clipping_delta, float delta_boost) {
    const float* window = this->window.data();
    int total_samples = this->size * this->oversample;
    int window_stride = this->max_oversample / this->oversample;
    for (int i = 0; i < total_samples; i++) {
        float limit = this->clip_level * *window;
        float effective_value = windowed_frame[i] + clipping_delta[i];
        if (effective_value > limit) {
            clipping_delta[i] += (limit - effective_value) * delta_boost;
        } else if (effective_value < -limit) {
            clipping_delta[i] += (-limit - effective_value) * delta_boost;
        }
        window += window_stride;
    }
}